

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall WrappedArgsParser::print_help(WrappedArgsParser *this)

{
  ostream *poVar1;
  void *this_00;
  doc_formatting *this_01;
  basic_ostream<char,_std::char_traits<char>_> *this_02;
  string *in_RDI;
  doc_formatting clipp_fmt;
  doc_formatting *in_stack_fffffffffffffa00;
  undefined8 in_stack_fffffffffffffa08;
  int col;
  doc_formatting *in_stack_fffffffffffffa10;
  string local_5c8 [80];
  man_page *in_stack_fffffffffffffa88;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffa90;
  doc_formatting *in_stack_fffffffffffffaa8;
  doc_formatting *in_stack_fffffffffffffab0;
  doc_formatting *in_stack_fffffffffffffb60;
  
  col = (int)((ulong)in_stack_fffffffffffffa08 >> 0x20);
  memset(&stack0xfffffffffffffaa8,0,0x2a8);
  clipp::doc_formatting::doc_formatting(in_stack_fffffffffffffb60);
  clipp::doc_formatting::first_column(in_stack_fffffffffffffa10,col);
  clipp::doc_formatting::doc_column(in_stack_fffffffffffffa10,col);
  clipp::doc_formatting::last_column(in_stack_fffffffffffffa10,col);
  clipp::doc_formatting::doc_formatting(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  clipp::doc_formatting::~doc_formatting(in_stack_fffffffffffffa00);
  poVar1 = std::operator<<((ostream *)&std::cout,in_RDI);
  poVar1 = std::operator<<(poVar1,
                           " - history manager command line wrapper, which eases access to hm-db application"
                          );
  this_00 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (doc_formatting *)(in_RDI + 0x368);
  std::__cxx11::string::string(local_5c8,in_RDI);
  clipp::make_man_page
            ((group *)clipp_fmt._96_8_,(doc_string *)clipp_fmt._88_8_,
             (doc_formatting *)clipp_fmt._80_8_);
  this_02 = clipp::operator<<(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  clipp::man_page::~man_page((man_page *)this_01);
  std::__cxx11::string::~string(local_5c8);
  clipp::doc_formatting::~doc_formatting(this_01);
  return;
}

Assistant:

void print_help() const {
    const auto clipp_fmt =
        doc_formatting{}.first_column(4).doc_column(28).last_column(80);

    std::cout << program_name
              << " - history manager command line wrapper, which eases access "
                 "to hm-db application"
              << std::endl
              << std::endl;
    std::cout << make_man_page(wrapper_cli, program_name, clipp_fmt)
              << std::endl;
  }